

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_scan_sse2_128_16.c
# Opt level: O0

parasail_result_t *
parasail_sg_flags_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int iVar1;
  int iVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  uint uVar5;
  longlong lVar6;
  longlong lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  longlong lVar12;
  longlong lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  __m128i *ptr;
  int16_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar34;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar47;
  ushort uVar50;
  undefined1 auVar35 [16];
  ushort uVar48;
  ushort uVar49;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ulong uVar46;
  undefined1 auVar56 [16];
  __m128i alVar57;
  int32_t in_stack_fffffffffffff718;
  int local_8d4;
  long local_8d0;
  long local_8c8;
  int local_8bc;
  ulong uStack_8a8;
  __m128i vH_1;
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m128i vCompare;
  __m128i vFt;
  __m128i vW;
  __m128i *pvW;
  __m128i vHp;
  __m128i vH;
  __m128i vF;
  __m128i vHt;
  __m128i vE;
  __m128i vGapper;
  int64_t tmp_1;
  int64_t tmp;
  __m128i_16_t e;
  __m128i_16_t h;
  int32_t segNum;
  int32_t index;
  parasail_result_t *result;
  __m128i vSegLenXgap;
  __m128i vNegInfFront;
  __m128i vPosMask;
  __m128i vMaxH;
  __m128i vSaturationCheckMax;
  __m128i vSaturationCheckMin;
  __m128i vPosLimit;
  __m128i vNegLimit;
  ushort local_71a;
  int16_t score;
  __m128i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m128i vGapE;
  __m128i vGapO;
  __m128i *pvGapper;
  __m128i *pvH;
  __m128i *pvHt;
  int16_t *boundary;
  __m128i *pvE;
  __m128i *pvP;
  int32_t position;
  int32_t offset;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t k;
  int32_t j;
  int32_t i;
  int s1_beg_local;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  parasail_profile_t *profile_local;
  short local_298;
  short sStack_296;
  short sStack_294;
  short sStack_292;
  short sStack_290;
  short sStack_28e;
  short sStack_28c;
  short sStack_28a;
  short local_288;
  short sStack_286;
  short sStack_284;
  short sStack_282;
  short sStack_280;
  short sStack_27e;
  short sStack_27c;
  short sStack_27a;
  short local_278;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_26a;
  short local_1f8;
  short sStack_1f6;
  short sStack_1f4;
  short sStack_1f2;
  short sStack_1f0;
  short sStack_1ee;
  short sStack_1ec;
  short sStack_1ea;
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  short local_1c8;
  short sStack_1c6;
  short sStack_1c4;
  short sStack_1c2;
  short sStack_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short local_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short local_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  short sStack_1a0;
  short sStack_19e;
  short sStack_19c;
  short sStack_19a;
  short sStack_196;
  short sStack_194;
  short sStack_192;
  short sStack_190;
  short sStack_18e;
  short sStack_18c;
  short sStack_18a;
  short local_188;
  short sStack_186;
  short sStack_184;
  short sStack_182;
  short sStack_180;
  short sStack_17e;
  short sStack_17c;
  short sStack_17a;
  short local_178;
  short sStack_176;
  short sStack_174;
  short sStack_172;
  short sStack_170;
  short sStack_16e;
  short sStack_16c;
  short sStack_16a;
  short local_168;
  short sStack_166;
  short sStack_164;
  short sStack_162;
  short sStack_160;
  short sStack_15e;
  short sStack_15c;
  short sStack_15a;
  short local_148;
  short sStack_146;
  short sStack_144;
  short sStack_142;
  short sStack_140;
  short sStack_13e;
  short sStack_13c;
  short sStack_13a;
  short local_128;
  short sStack_126;
  short sStack_124;
  short sStack_122;
  short sStack_120;
  short sStack_11e;
  short sStack_11c;
  short sStack_11a;
  short local_118;
  short sStack_116;
  short sStack_114;
  short sStack_112;
  short sStack_110;
  short sStack_10e;
  short sStack_10c;
  short sStack_10a;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_22;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  short sStack_1a;
  
  _segNum = (parasail_profile_t *)0x0;
  if (profile == (parasail_profile_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_16","profile")
    ;
    profile_local = (parasail_profile_t *)0x0;
  }
  else if ((profile->profile16).score == (void *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_16",
            "profile->profile16.score");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->matrix == (parasail_matrix_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_16",
            "profile->matrix");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (profile->s1Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_sse2_128_16",
            "profile->s1Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2 == (char *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sg_flags_table_scan_profile_sse2_128_16","s2");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (s2Len < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sg_flags_table_scan_profile_sse2_128_16",
            "s2Len");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (open < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_sse2_128_16",
            "open");
    profile_local = (parasail_profile_t *)0x0;
  }
  else if (gap < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sg_flags_table_scan_profile_sse2_128_16","gap"
           );
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = profile->s1Len;
    matrix._4_4_ = s2Len + -1;
    ppVar3 = profile->matrix;
    iVar31 = (iVar1 + 7) / 8;
    iVar34 = (iVar1 + -1) % iVar31;
    iVar32 = ~((iVar1 + -1) / iVar31) + 8;
    pvVar4 = (profile->profile16).score;
    s1_beg_local._0_2_ = (short)open;
    uVar8 = CONCAT26((short)s1_beg_local,
                     CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local))
                    );
    uVar9 = CONCAT26((short)s1_beg_local,
                     CONCAT24((short)s1_beg_local,CONCAT22((short)s1_beg_local,(short)s1_beg_local))
                    );
    i._0_2_ = (short)gap;
    uVar10 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    uVar11 = CONCAT26((short)i,CONCAT24((short)i,CONCAT22((short)i,(short)i)));
    if (ppVar3->min <= -open) {
      s1_beg_local._0_2_ = -(short)ppVar3->min;
    }
    uVar28 = (short)s1_beg_local + 0x8001;
    sVar29 = ((ushort)ppVar3->max ^ 0x7fff) - 1;
    lVar12 = CONCAT26(uVar28,CONCAT24(uVar28,CONCAT22(uVar28,uVar28)));
    lVar13 = CONCAT26(uVar28,CONCAT24(uVar28,CONCAT22(uVar28,uVar28)));
    vSaturationCheckMax[1] = CONCAT26(sVar29,CONCAT24(sVar29,CONCAT22(sVar29,sVar29)));
    vSaturationCheckMin[0] = CONCAT26(sVar29,CONCAT24(sVar29,CONCAT22(sVar29,sVar29)));
    pvP._0_2_ = (short)iVar32;
    vSegLenXgap[1] = CONCAT62(0,uVar28);
    uVar30 = -(short)iVar31 * (short)i;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = vSegLenXgap[1];
    auVar35._8_8_ =
         CONCAT26(uVar30,CONCAT24(uVar30,CONCAT22(uVar30,uVar30))) << 0x10 | (ulong)uVar30;
    auVar35._0_8_ = CONCAT26(uVar30,CONCAT24(uVar30,CONCAT22(uVar30,uVar30))) << 0x10;
    _result = paddsw(auVar56,auVar35);
    iVar33 = s1_beg;
    _segNum = (parasail_profile_t *)parasail_result_new_table1(iVar31 * 8,s2Len);
    if (_segNum == (parasail_profile_t *)0x0) {
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x8200402;
      uVar5 = 0;
      if (s1_beg != 0) {
        uVar5 = 8;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      uVar5 = 0;
      if (s1_end != 0) {
        uVar5 = 0x10;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      uVar5 = 0;
      if (s2_beg != 0) {
        uVar5 = 0x4000;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      uVar5 = 0;
      if (s2_end != 0) {
        uVar5 = 0x8000;
      }
      *(uint *)&_segNum->field_0xc = uVar5 | *(uint *)&_segNum->field_0xc;
      *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x20000;
      ptr = parasail_memalign___m128i(0x10,(long)iVar31);
      ptr_00 = parasail_memalign_int16_t(0x10,(long)(s2Len + 1));
      ptr_01 = parasail_memalign___m128i(0x10,(long)iVar31);
      ptr_02 = parasail_memalign___m128i(0x10,(long)iVar31);
      ptr_03 = parasail_memalign___m128i(0x10,(long)iVar31);
      if (ptr == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_00 == (int16_t *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_01 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_02 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else if (ptr_03 == (__m128i *)0x0) {
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        h.m[1]._4_4_ = 0;
        for (k = 0; k < iVar31; k = k + 1) {
          for (h.m[1]._0_4_ = 0; (int)h.m[1]._0_4_ < 8; h.m[1]._0_4_ = h.m[1]._0_4_ + 1) {
            if (s1_beg == 0) {
              local_8bc = -(gap * (h.m[1]._0_4_ * iVar31 + k)) - open;
            }
            else {
              local_8bc = 0;
            }
            local_8d0 = (long)local_8bc;
            local_8c8 = local_8d0;
            if (local_8d0 < -0x8000) {
              local_8c8 = -0x8000;
            }
            *(short *)((long)&e + (long)(int)h.m[1]._0_4_ * 2 + 8) = (short)local_8c8;
            local_8d0 = local_8d0 - open;
            if (local_8d0 < -0x8000) {
              local_8d0 = -0x8000;
            }
            *(short *)((long)&tmp + (long)(int)h.m[1]._0_4_ * 2) = (short)local_8d0;
          }
          ptr_02[(int)h.m[1]._4_4_][0] = e.m[1];
          ptr_02[(int)h.m[1]._4_4_][1] = h.m[0];
          ptr[(int)h.m[1]._4_4_][0] = tmp;
          ptr[(int)h.m[1]._4_4_][1] = e.m[0];
          h.m[1]._4_4_ = h.m[1]._4_4_ + 1;
        }
        *ptr_00 = 0;
        for (k = 1; k <= s2Len; k = k + 1) {
          if (s2_beg == 0) {
            local_8d4 = -(gap * (k + -1)) - open;
          }
          else {
            local_8d4 = 0;
          }
          if (local_8d4 < -0x8000) {
            local_8d4 = -0x8000;
          }
          ptr_00[k] = (int16_t)local_8d4;
        }
        auVar25._8_8_ = uVar9;
        auVar25._0_8_ = uVar8;
        register0x00001200 = psubsw(ZEXT816(0),auVar25);
        k = iVar31;
        while (k = k + -1, -1 < k) {
          ptr_03[k][0] = vE[1];
          ptr_03[k][1] = vGapper[0];
          auVar24._8_8_ = uVar11;
          auVar24._0_8_ = uVar10;
          register0x00001200 = psubsw(stack0xfffffffffffff808,auVar24);
          local_278 = (short)vSaturationCheckMax[1];
          sStack_276 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
          sStack_274 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
          sStack_272 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
          sStack_270 = (short)vSaturationCheckMin[0];
          sStack_26e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
          sStack_26c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
          sStack_26a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
          local_288 = (short)vE[1];
          sStack_286 = vE[1]._2_2_;
          sStack_284 = vE[1]._4_2_;
          sStack_282 = vE[1]._6_2_;
          sStack_280 = (short)vE[2];
          sStack_27e = vE[2]._2_2_;
          sStack_27c = vE[2]._4_2_;
          sStack_27a = vE[2]._6_2_;
          vSaturationCheckMax[1]._0_4_ =
               CONCAT22((ushort)(sStack_286 < sStack_276) * sStack_286 |
                        (ushort)(sStack_286 >= sStack_276) * sStack_276,
                        (ushort)(local_288 < local_278) * local_288 |
                        (ushort)(local_288 >= local_278) * local_278);
          vSaturationCheckMax[1]._0_6_ =
               CONCAT24((ushort)(sStack_284 < sStack_274) * sStack_284 |
                        (ushort)(sStack_284 >= sStack_274) * sStack_274,
                        (undefined4)vSaturationCheckMax[1]);
          vSaturationCheckMax[1] =
               CONCAT26((ushort)(sStack_282 < sStack_272) * sStack_282 |
                        (ushort)(sStack_282 >= sStack_272) * sStack_272,
                        (undefined6)vSaturationCheckMax[1]);
          vSaturationCheckMin[0]._0_4_ =
               CONCAT22((ushort)(sStack_27e < sStack_26e) * sStack_27e |
                        (ushort)(sStack_27e >= sStack_26e) * sStack_26e,
                        (ushort)(sStack_280 < sStack_270) * sStack_280 |
                        (ushort)(sStack_280 >= sStack_270) * sStack_270);
          vSaturationCheckMin[0]._0_6_ =
               CONCAT24((ushort)(sStack_27c < sStack_26c) * sStack_27c |
                        (ushort)(sStack_27c >= sStack_26c) * sStack_26c,
                        (undefined4)vSaturationCheckMin[0]);
          vSaturationCheckMin[0] =
               CONCAT26((ushort)(sStack_27a < sStack_26a) * sStack_27a |
                        (ushort)(sStack_27a >= sStack_26a) * sStack_26a,
                        (undefined6)vSaturationCheckMin[0]);
        }
        vPosMask[1] = lVar12;
        vMaxH[0] = lVar13;
        vMaxH[1] = lVar12;
        vSaturationCheckMax[0] = lVar13;
        for (end_query = 0; end_query < s2Len; end_query = end_query + 1) {
          uVar46 = ptr_02[iVar31 + -1][0];
          vHp[0] = ptr_02[iVar31 + -1][1] << 0x10 | uVar46 >> 0x30;
          pvW = (__m128i *)(uVar46 << 0x10 | (ulong)(ushort)ptr_00[end_query]);
          iVar2 = ppVar3->mapper[(byte)s2[end_query]];
          auVar23._8_8_ = lVar13;
          auVar23._0_8_ = lVar12;
          register0x00001200 = psubsw(auVar23,(undefined1  [16])*ptr_03);
          vF[0] = lVar13;
          vH[1] = lVar12;
          k = 0;
          while( true ) {
            local_118 = (short)vH[1];
            sStack_116 = vH[1]._2_2_;
            sStack_114 = vH[1]._4_2_;
            sStack_112 = vH[1]._6_2_;
            sStack_110 = (short)vH[2];
            sStack_10e = vH[2]._2_2_;
            sStack_10c = vH[2]._4_2_;
            sStack_10a = vH[2]._6_2_;
            if (iVar31 <= k) break;
            alVar57 = ptr_02[k];
            auVar22._8_8_ = uVar11;
            auVar22._0_8_ = uVar10;
            auVar56 = psubsw((undefined1  [16])ptr[k],auVar22);
            auVar21._8_8_ = uVar9;
            auVar21._0_8_ = uVar8;
            auVar35 = psubsw((undefined1  [16])ptr_02[k],auVar21);
            local_f8 = auVar56._0_2_;
            sStack_f6 = auVar56._2_2_;
            sStack_f4 = auVar56._4_2_;
            sStack_f2 = auVar56._6_2_;
            sStack_f0 = auVar56._8_2_;
            sStack_ee = auVar56._10_2_;
            sStack_ec = auVar56._12_2_;
            sStack_ea = auVar56._14_2_;
            local_108 = auVar35._0_2_;
            sStack_106 = auVar35._2_2_;
            sStack_104 = auVar35._4_2_;
            sStack_102 = auVar35._6_2_;
            sStack_100 = auVar35._8_2_;
            sStack_fe = auVar35._10_2_;
            sStack_fc = auVar35._12_2_;
            sStack_fa = auVar35._14_2_;
            uVar30 = (ushort)(local_f8 < local_108) * local_108 |
                     (ushort)(local_f8 >= local_108) * local_f8;
            uVar36 = (ushort)(sStack_f6 < sStack_106) * sStack_106 |
                     (ushort)(sStack_f6 >= sStack_106) * sStack_f6;
            uVar37 = (ushort)(sStack_f4 < sStack_104) * sStack_104 |
                     (ushort)(sStack_f4 >= sStack_104) * sStack_f4;
            uVar39 = (ushort)(sStack_f2 < sStack_102) * sStack_102 |
                     (ushort)(sStack_f2 >= sStack_102) * sStack_f2;
            uVar43 = (ushort)(sStack_f0 < sStack_100) * sStack_100 |
                     (ushort)(sStack_f0 >= sStack_100) * sStack_f0;
            uVar47 = (ushort)(sStack_ee < sStack_fe) * sStack_fe |
                     (ushort)(sStack_ee >= sStack_fe) * sStack_ee;
            uVar50 = (ushort)(sStack_ec < sStack_fc) * sStack_fc |
                     (ushort)(sStack_ec >= sStack_fc) * sStack_ec;
            uVar53 = (ushort)(sStack_ea < sStack_fa) * sStack_fa |
                     (ushort)(sStack_ea >= sStack_fa) * sStack_ea;
            vHt[1] = CONCAT26(uVar39,CONCAT24(uVar37,CONCAT22(uVar36,uVar30)));
            vE[0] = CONCAT26(uVar53,CONCAT24(uVar50,CONCAT22(uVar47,uVar43)));
            auVar35 = paddsw((undefined1  [16])_pvW,
                             *(undefined1 (*) [16])
                              ((long)pvVar4 + (long)k * 0x10 + (long)(iVar2 * iVar31) * 0x10));
            auVar56 = paddsw(stack0xfffffffffffff7e8,(undefined1  [16])ptr_03[k]);
            local_128 = auVar56._0_2_;
            sStack_126 = auVar56._2_2_;
            sStack_124 = auVar56._4_2_;
            sStack_122 = auVar56._6_2_;
            sStack_120 = auVar56._8_2_;
            sStack_11e = auVar56._10_2_;
            sStack_11c = auVar56._12_2_;
            sStack_11a = auVar56._14_2_;
            vH[1]._0_4_ = CONCAT22((ushort)(sStack_116 < sStack_126) * sStack_126 |
                                   (ushort)(sStack_116 >= sStack_126) * sStack_116,
                                   (ushort)(local_118 < local_128) * local_128 |
                                   (ushort)(local_118 >= local_128) * local_118);
            vH[1]._0_6_ = CONCAT24((ushort)(sStack_114 < sStack_124) * sStack_124 |
                                   (ushort)(sStack_114 >= sStack_124) * sStack_114,(undefined4)vH[1]
                                  );
            vH[1] = CONCAT26((ushort)(sStack_112 < sStack_122) * sStack_122 |
                             (ushort)(sStack_112 >= sStack_122) * sStack_112,(undefined6)vH[1]);
            vF[0]._0_2_ = (ushort)(sStack_110 < sStack_120) * sStack_120 |
                          (ushort)(sStack_110 >= sStack_120) * sStack_110;
            vF[0]._2_2_ = (ushort)(sStack_10e < sStack_11e) * sStack_11e |
                          (ushort)(sStack_10e >= sStack_11e) * sStack_10e;
            vF[0]._4_2_ = (ushort)(sStack_10c < sStack_11c) * sStack_11c |
                          (ushort)(sStack_10c >= sStack_11c) * sStack_10c;
            vF[0]._6_2_ = (ushort)(sStack_10a < sStack_11a) * sStack_11a |
                          (ushort)(sStack_10a >= sStack_11a) * sStack_10a;
            local_148 = auVar35._0_2_;
            sStack_146 = auVar35._2_2_;
            sStack_144 = auVar35._4_2_;
            sStack_142 = auVar35._6_2_;
            sStack_140 = auVar35._8_2_;
            sStack_13e = auVar35._10_2_;
            sStack_13c = auVar35._12_2_;
            sStack_13a = auVar35._14_2_;
            vF[1] = CONCAT26((ushort)((short)uVar39 < sStack_142) * sStack_142 |
                             ((short)uVar39 >= sStack_142) * uVar39,
                             CONCAT24((ushort)((short)uVar37 < sStack_144) * sStack_144 |
                                      ((short)uVar37 >= sStack_144) * uVar37,
                                      CONCAT22((ushort)((short)uVar36 < sStack_146) * sStack_146 |
                                               ((short)uVar36 >= sStack_146) * uVar36,
                                               (ushort)((short)uVar30 < local_148) * local_148 |
                                               ((short)uVar30 >= local_148) * uVar30)));
            vHt[0]._0_2_ = (ushort)((short)uVar43 < sStack_140) * sStack_140 |
                           ((short)uVar43 >= sStack_140) * uVar43;
            vHt[0]._2_2_ = (ushort)((short)uVar47 < sStack_13e) * sStack_13e |
                           ((short)uVar47 >= sStack_13e) * uVar47;
            vHt[0]._4_2_ = (ushort)((short)uVar50 < sStack_13c) * sStack_13c |
                           ((short)uVar50 >= sStack_13c) * uVar50;
            vHt[0]._6_2_ = (ushort)((short)uVar53 < sStack_13a) * sStack_13a |
                           ((short)uVar53 >= sStack_13a) * uVar53;
            ptr[k][0] = vHt[1];
            ptr[k][1] = vE[0];
            ptr_01[k][0] = vF[1];
            ptr_01[k][1] = vHt[0];
            k = k + 1;
            _pvW = alVar57;
          }
          uVar30 = ptr_00[(long)end_query + 1];
          auVar17._8_8_ = vHt[0] << 0x10 | (ulong)vF[1] >> 0x30;
          auVar17._0_8_ = vF[1] << 0x10 | (ulong)uVar30;
          auVar35 = paddsw(auVar17,(undefined1  [16])*ptr_03);
          local_168 = auVar35._0_2_;
          sStack_166 = auVar35._2_2_;
          sStack_164 = auVar35._4_2_;
          sStack_162 = auVar35._6_2_;
          sStack_160 = auVar35._8_2_;
          sStack_15e = auVar35._10_2_;
          sStack_15c = auVar35._12_2_;
          sStack_15a = auVar35._14_2_;
          vH[1]._0_4_ = CONCAT22((ushort)(sStack_116 < sStack_166) * sStack_166 |
                                 (ushort)(sStack_116 >= sStack_166) * sStack_116,
                                 (ushort)(local_118 < local_168) * local_168 |
                                 (ushort)(local_118 >= local_168) * local_118);
          vH[1]._0_6_ = CONCAT24((ushort)(sStack_114 < sStack_164) * sStack_164 |
                                 (ushort)(sStack_114 >= sStack_164) * sStack_114,(undefined4)vH[1]);
          vH[1] = CONCAT26((ushort)(sStack_112 < sStack_162) * sStack_162 |
                           (ushort)(sStack_112 >= sStack_162) * sStack_112,(undefined6)vH[1]);
          vF[0]._0_2_ = (ushort)(sStack_110 < sStack_160) * sStack_160 |
                        (ushort)(sStack_110 >= sStack_160) * sStack_110;
          vF[0]._2_2_ = (ushort)(sStack_10e < sStack_15e) * sStack_15e |
                        (ushort)(sStack_10e >= sStack_15e) * sStack_10e;
          vF[0]._4_2_ = (ushort)(sStack_10c < sStack_15c) * sStack_15c |
                        (ushort)(sStack_10c >= sStack_15c) * sStack_10c;
          vF[0]._6_2_ = (ushort)(sStack_10a < sStack_15a) * sStack_15a |
                        (ushort)(sStack_10a >= sStack_15a) * sStack_10a;
          k = 0;
          while( true ) {
            if (5 < k) break;
            auVar16._8_8_ = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
            auVar16._0_8_ = vH[1] << 0x10;
            auVar35 = paddsw(auVar16,_result);
            local_178 = (short)vH[1];
            sStack_176 = vH[1]._2_2_;
            sStack_174 = vH[1]._4_2_;
            sStack_172 = vH[1]._6_2_;
            sStack_170 = (short)vH[2];
            sStack_16e = vH[2]._2_2_;
            sStack_16c = vH[2]._4_2_;
            sStack_16a = vH[2]._6_2_;
            local_188 = auVar35._0_2_;
            sStack_186 = auVar35._2_2_;
            sStack_184 = auVar35._4_2_;
            sStack_182 = auVar35._6_2_;
            sStack_180 = auVar35._8_2_;
            sStack_17e = auVar35._10_2_;
            sStack_17c = auVar35._12_2_;
            sStack_17a = auVar35._14_2_;
            vH[1]._0_4_ = CONCAT22((ushort)(sStack_176 < sStack_186) * sStack_186 |
                                   (ushort)(sStack_176 >= sStack_186) * sStack_176,
                                   (ushort)(local_178 < local_188) * local_188 |
                                   (ushort)(local_178 >= local_188) * local_178);
            vH[1]._0_6_ = CONCAT24((ushort)(sStack_174 < sStack_184) * sStack_184 |
                                   (ushort)(sStack_174 >= sStack_184) * sStack_174,(undefined4)vH[1]
                                  );
            vH[1] = CONCAT26((ushort)(sStack_172 < sStack_182) * sStack_182 |
                             (ushort)(sStack_172 >= sStack_182) * sStack_172,(undefined6)vH[1]);
            vF[0]._0_2_ = (ushort)(sStack_170 < sStack_180) * sStack_180 |
                          (ushort)(sStack_170 >= sStack_180) * sStack_170;
            vF[0]._2_2_ = (ushort)(sStack_16e < sStack_17e) * sStack_17e |
                          (ushort)(sStack_16e >= sStack_17e) * sStack_16e;
            vF[0]._4_2_ = (ushort)(sStack_16c < sStack_17c) * sStack_17c |
                          (ushort)(sStack_16c >= sStack_17c) * sStack_16c;
            vF[0]._6_2_ = (ushort)(sStack_16a < sStack_17a) * sStack_17a |
                          (ushort)(sStack_16a >= sStack_17a) * sStack_16a;
            k = k + 1;
          }
          auVar15._8_8_ = vF[0] << 0x10 | (ulong)vH[1] >> 0x30;
          auVar15._0_8_ = vH[1] << 0x10;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = vSegLenXgap[1];
          register0x00001200 = paddsw(auVar15,auVar14);
          sStack_196 = (short)vF[1];
          sStack_194 = vF[1]._2_2_;
          sStack_192 = vF[1]._4_2_;
          sStack_190 = vF[1]._6_2_;
          sStack_18e = (short)vF[2];
          sStack_18c = vF[2]._2_2_;
          sStack_18a = vF[2]._4_2_;
          local_1a8 = (short)vH[1];
          sStack_1a6 = vH[1]._2_2_;
          sStack_1a4 = vH[1]._4_2_;
          sStack_1a2 = vH[1]._6_2_;
          sStack_1a0 = (short)vH[2];
          sStack_19e = vH[2]._2_2_;
          sStack_19c = vH[2]._4_2_;
          sStack_19a = vH[2]._6_2_;
          vHp[1]._0_4_ = CONCAT22((ushort)(sStack_196 < sStack_1a6) * sStack_1a6 |
                                  (ushort)(sStack_196 >= sStack_1a6) * sStack_196,
                                  (ushort)((short)uVar30 < local_1a8) * local_1a8 |
                                  ((short)uVar30 >= local_1a8) * uVar30);
          vHp[1]._0_6_ = CONCAT24((ushort)(sStack_194 < sStack_1a4) * sStack_1a4 |
                                  (ushort)(sStack_194 >= sStack_1a4) * sStack_194,(undefined4)vHp[1]
                                 );
          vHp[1] = CONCAT26((ushort)(sStack_192 < sStack_1a2) * sStack_1a2 |
                            (ushort)(sStack_192 >= sStack_1a2) * sStack_192,(undefined6)vHp[1]);
          vH[0]._0_4_ = CONCAT22((ushort)(sStack_18e < sStack_19e) * sStack_19e |
                                 (ushort)(sStack_18e >= sStack_19e) * sStack_18e,
                                 (ushort)(sStack_190 < sStack_1a0) * sStack_1a0 |
                                 (ushort)(sStack_190 >= sStack_1a0) * sStack_190);
          vH[0]._0_6_ = CONCAT24((ushort)(sStack_18c < sStack_19c) * sStack_19c |
                                 (ushort)(sStack_18c >= sStack_19c) * sStack_18c,(undefined4)vH[0]);
          vH[0] = CONCAT26((ushort)(sStack_18a < sStack_19a) * sStack_19a |
                           (ushort)(sStack_18a >= sStack_19a) * sStack_18a,(undefined6)vH[0]);
          for (k = 0; k < iVar31; k = k + 1) {
            lVar6 = ptr_01[k][0];
            lVar7 = ptr_01[k][1];
            auVar20._8_8_ = uVar11;
            auVar20._0_8_ = uVar10;
            auVar56 = psubsw(stack0xfffffffffffff7d8,auVar20);
            auVar19._8_8_ = vH[0];
            auVar19._0_8_ = vHp[1];
            auVar18._8_8_ = uVar9;
            auVar18._0_8_ = uVar8;
            auVar35 = psubsw(auVar19,auVar18);
            local_1b8 = auVar56._0_2_;
            sStack_1b6 = auVar56._2_2_;
            sStack_1b4 = auVar56._4_2_;
            sStack_1b2 = auVar56._6_2_;
            sStack_1b0 = auVar56._8_2_;
            sStack_1ae = auVar56._10_2_;
            sStack_1ac = auVar56._12_2_;
            sStack_1aa = auVar56._14_2_;
            local_1c8 = auVar35._0_2_;
            sStack_1c6 = auVar35._2_2_;
            sStack_1c4 = auVar35._4_2_;
            sStack_1c2 = auVar35._6_2_;
            sStack_1c0 = auVar35._8_2_;
            sStack_1be = auVar35._10_2_;
            sStack_1bc = auVar35._12_2_;
            sStack_1ba = auVar35._14_2_;
            uVar30 = (ushort)(local_1b8 < local_1c8) * local_1c8 |
                     (ushort)(local_1b8 >= local_1c8) * local_1b8;
            uVar39 = (ushort)(sStack_1b6 < sStack_1c6) * sStack_1c6 |
                     (ushort)(sStack_1b6 >= sStack_1c6) * sStack_1b6;
            uVar50 = (ushort)(sStack_1b4 < sStack_1c4) * sStack_1c4 |
                     (ushort)(sStack_1b4 >= sStack_1c4) * sStack_1b4;
            uVar40 = (ushort)(sStack_1b2 < sStack_1c2) * sStack_1c2 |
                     (ushort)(sStack_1b2 >= sStack_1c2) * sStack_1b2;
            vF[0]._0_2_ = (ushort)(sStack_1b0 < sStack_1c0) * sStack_1c0 |
                          (ushort)(sStack_1b0 >= sStack_1c0) * sStack_1b0;
            vF[0]._2_2_ = (ushort)(sStack_1ae < sStack_1be) * sStack_1be |
                          (ushort)(sStack_1ae >= sStack_1be) * sStack_1ae;
            vF[0]._4_2_ = (ushort)(sStack_1ac < sStack_1bc) * sStack_1bc |
                          (ushort)(sStack_1ac >= sStack_1bc) * sStack_1ac;
            vF[0]._6_2_ = (ushort)(sStack_1aa < sStack_1ba) * sStack_1ba |
                          (ushort)(sStack_1aa >= sStack_1ba) * sStack_1aa;
            vH[1]._0_4_ = CONCAT22(uVar39,uVar30);
            vH[1]._0_6_ = CONCAT24(uVar50,(undefined4)vH[1]);
            vH[1] = CONCAT26(uVar40,(undefined6)vH[1]);
            local_1d8 = (short)lVar6;
            sStack_1d6 = (short)((ulong)lVar6 >> 0x10);
            sStack_1d4 = (short)((ulong)lVar6 >> 0x20);
            sStack_1d2 = (short)((ulong)lVar6 >> 0x30);
            sStack_1d0 = (short)lVar7;
            sStack_1ce = (short)((ulong)lVar7 >> 0x10);
            sStack_1cc = (short)((ulong)lVar7 >> 0x20);
            sStack_1ca = (short)((ulong)lVar7 >> 0x30);
            uVar36 = (local_1d8 < (short)uVar30) * uVar30 |
                     (ushort)(local_1d8 >= (short)uVar30) * local_1d8;
            uVar43 = (sStack_1d6 < (short)uVar39) * uVar39 |
                     (ushort)(sStack_1d6 >= (short)uVar39) * sStack_1d6;
            uVar53 = (sStack_1d4 < (short)uVar50) * uVar50 |
                     (ushort)(sStack_1d4 >= (short)uVar50) * sStack_1d4;
            uVar41 = (sStack_1d2 < (short)uVar40) * uVar40 |
                     (ushort)(sStack_1d2 >= (short)uVar40) * sStack_1d2;
            uVar44 = (sStack_1d0 < (short)(ushort)vF[0]) * (ushort)vF[0] |
                     (ushort)(sStack_1d0 >= (short)(ushort)vF[0]) * sStack_1d0;
            uVar48 = (sStack_1ce < (short)vF[0]._2_2_) * vF[0]._2_2_ |
                     (ushort)(sStack_1ce >= (short)vF[0]._2_2_) * sStack_1ce;
            uVar51 = (sStack_1cc < (short)vF[0]._4_2_) * vF[0]._4_2_ |
                     (ushort)(sStack_1cc >= (short)vF[0]._4_2_) * sStack_1cc;
            uVar54 = (sStack_1ca < (short)vF[0]._6_2_) * vF[0]._6_2_ |
                     (ushort)(sStack_1ca >= (short)vF[0]._6_2_) * sStack_1ca;
            vHp[1]._0_4_ = CONCAT22(uVar43,uVar36);
            vHp[1]._0_6_ = CONCAT24(uVar53,(undefined4)vHp[1]);
            vHp[1] = CONCAT26(uVar41,(undefined6)vHp[1]);
            vH[0]._0_4_ = CONCAT22(uVar48,uVar44);
            vH[0]._0_6_ = CONCAT24(uVar51,(undefined4)vH[0]);
            vH[0] = CONCAT26(uVar54,(undefined6)vH[0]);
            ptr_02[k][0] = vHp[1];
            ptr_02[k][1] = vH[0];
            local_298 = (short)vSaturationCheckMax[1];
            sStack_296 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
            sStack_294 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
            sStack_292 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
            sStack_290 = (short)vSaturationCheckMin[0];
            sStack_28e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
            sStack_28c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
            sStack_28a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
            uVar37 = ((short)uVar36 < local_298) * uVar36 |
                     (ushort)((short)uVar36 >= local_298) * local_298;
            uVar47 = ((short)uVar43 < sStack_296) * uVar43 |
                     (ushort)((short)uVar43 >= sStack_296) * sStack_296;
            uVar38 = ((short)uVar53 < sStack_294) * uVar53 |
                     (ushort)((short)uVar53 >= sStack_294) * sStack_294;
            uVar42 = ((short)uVar41 < sStack_292) * uVar41 |
                     (ushort)((short)uVar41 >= sStack_292) * sStack_292;
            uVar45 = ((short)uVar44 < sStack_290) * uVar44 |
                     (ushort)((short)uVar44 >= sStack_290) * sStack_290;
            uVar49 = ((short)uVar48 < sStack_28e) * uVar48 |
                     (ushort)((short)uVar48 >= sStack_28e) * sStack_28e;
            uVar52 = ((short)uVar51 < sStack_28c) * uVar51 |
                     (ushort)((short)uVar51 >= sStack_28c) * sStack_28c;
            uVar55 = ((short)uVar54 < sStack_28a) * uVar54 |
                     (ushort)((short)uVar54 >= sStack_28a) * sStack_28a;
            vSaturationCheckMax[1]._0_4_ =
                 CONCAT22(((short)uVar39 < (short)uVar47) * uVar39 |
                          ((short)uVar39 >= (short)uVar47) * uVar47,
                          ((short)uVar30 < (short)uVar37) * uVar30 |
                          ((short)uVar30 >= (short)uVar37) * uVar37);
            vSaturationCheckMax[1]._0_6_ =
                 CONCAT24(((short)uVar50 < (short)uVar38) * uVar50 |
                          ((short)uVar50 >= (short)uVar38) * uVar38,
                          (undefined4)vSaturationCheckMax[1]);
            vSaturationCheckMax[1] =
                 CONCAT26(((short)uVar40 < (short)uVar42) * uVar40 |
                          ((short)uVar40 >= (short)uVar42) * uVar42,
                          (undefined6)vSaturationCheckMax[1]);
            vSaturationCheckMin[0]._0_4_ =
                 CONCAT22(((short)vF[0]._2_2_ < (short)uVar49) * vF[0]._2_2_ |
                          ((short)vF[0]._2_2_ >= (short)uVar49) * uVar49,
                          ((short)(ushort)vF[0] < (short)uVar45) * (ushort)vF[0] |
                          ((short)(ushort)vF[0] >= (short)uVar45) * uVar45);
            vSaturationCheckMin[0]._0_6_ =
                 CONCAT24(((short)vF[0]._4_2_ < (short)uVar52) * vF[0]._4_2_ |
                          ((short)vF[0]._4_2_ >= (short)uVar52) * uVar52,
                          (undefined4)vSaturationCheckMin[0]);
            vSaturationCheckMin[0] =
                 CONCAT26(((short)vF[0]._6_2_ < (short)uVar55) * vF[0]._6_2_ |
                          ((short)vF[0]._6_2_ >= (short)uVar55) * uVar55,
                          (undefined6)vSaturationCheckMin[0]);
            local_1f8 = (short)vMaxH[1];
            sStack_1f6 = (short)((ulong)vMaxH[1] >> 0x10);
            sStack_1f4 = (short)((ulong)vMaxH[1] >> 0x20);
            sStack_1f2 = (short)((ulong)vMaxH[1] >> 0x30);
            sStack_1f0 = (short)vSaturationCheckMax[0];
            sStack_1ee = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
            sStack_1ec = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
            sStack_1ea = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
            vMaxH[1] = CONCAT26((sStack_1f2 < (short)uVar41) * uVar41 |
                                (ushort)(sStack_1f2 >= (short)uVar41) * sStack_1f2,
                                CONCAT24((sStack_1f4 < (short)uVar53) * uVar53 |
                                         (ushort)(sStack_1f4 >= (short)uVar53) * sStack_1f4,
                                         CONCAT22((sStack_1f6 < (short)uVar43) * uVar43 |
                                                  (ushort)(sStack_1f6 >= (short)uVar43) * sStack_1f6
                                                  ,(local_1f8 < (short)uVar36) * uVar36 |
                                                   (ushort)(local_1f8 >= (short)uVar36) * local_1f8)
                                        ));
            vSaturationCheckMax[0] =
                 CONCAT26((sStack_1ea < (short)uVar54) * uVar54 |
                          (ushort)(sStack_1ea >= (short)uVar54) * sStack_1ea,
                          CONCAT24((sStack_1ec < (short)uVar51) * uVar51 |
                                   (ushort)(sStack_1ec >= (short)uVar51) * sStack_1ec,
                                   CONCAT22((sStack_1ee < (short)uVar48) * uVar48 |
                                            (ushort)(sStack_1ee >= (short)uVar48) * sStack_1ee,
                                            (sStack_1f0 < (short)uVar44) * uVar44 |
                                            (ushort)(sStack_1f0 >= (short)uVar44) * sStack_1f0)));
            alVar57[0] = (ulong)(uint)k;
            alVar57[1]._0_4_ = iVar31;
            alVar57[1]._4_4_ = 0;
            arr_store_si128(((anon_union_8_5_1bed06c4_for_parasail_result_4 *)&_segNum->matrix)->
                            rowcols->score_row,alVar57,end_query,s2Len,iVar33,
                            in_stack_fffffffffffff718);
          }
          lVar6 = ptr_02[iVar34][0];
          lVar7 = ptr_02[iVar34][1];
          local_98 = (short)lVar6;
          sStack_96 = (short)((ulong)lVar6 >> 0x10);
          sStack_94 = (short)((ulong)lVar6 >> 0x20);
          sStack_92 = (short)((ulong)lVar6 >> 0x30);
          sStack_90 = (short)lVar7;
          sStack_8e = (short)((ulong)lVar7 >> 0x10);
          sStack_8c = (short)((ulong)lVar7 >> 0x20);
          sStack_8a = (short)((ulong)lVar7 >> 0x30);
          local_a8 = (short)vPosMask[1];
          sStack_a6 = (short)((ulong)vPosMask[1] >> 0x10);
          sStack_a4 = (short)((ulong)vPosMask[1] >> 0x20);
          sStack_a2 = (short)((ulong)vPosMask[1] >> 0x30);
          sStack_a0 = (short)vMaxH[0];
          sStack_9e = (short)((ulong)vMaxH[0] >> 0x10);
          sStack_9c = (short)((ulong)vMaxH[0] >> 0x20);
          sStack_9a = (short)((ulong)vMaxH[0] >> 0x30);
          uVar46 = CONCAT26(-(ushort)((short)pvP == 0),
                            CONCAT24(-(ushort)((short)pvP == 1),
                                     CONCAT22(-(ushort)((short)pvP == 2),-(ushort)((short)pvP == 3))
                                    )) &
                   CONCAT26(-(ushort)(sStack_9a < sStack_8a),
                            CONCAT24(-(ushort)(sStack_9c < sStack_8c),
                                     CONCAT22(-(ushort)(sStack_9e < sStack_8e),
                                              -(ushort)(sStack_a0 < sStack_90))));
          vPosMask[1] = CONCAT26((ushort)(sStack_92 < sStack_a2) * sStack_a2 |
                                 (ushort)(sStack_92 >= sStack_a2) * sStack_92,
                                 CONCAT24((ushort)(sStack_94 < sStack_a4) * sStack_a4 |
                                          (ushort)(sStack_94 >= sStack_a4) * sStack_94,
                                          CONCAT22((ushort)(sStack_96 < sStack_a6) * sStack_a6 |
                                                   (ushort)(sStack_96 >= sStack_a6) * sStack_96,
                                                   (ushort)(local_98 < local_a8) * local_a8 |
                                                   (ushort)(local_98 >= local_a8) * local_98)));
          vMaxH[0] = CONCAT26((ushort)(sStack_8a < sStack_9a) * sStack_9a |
                              (ushort)(sStack_8a >= sStack_9a) * sStack_8a,
                              CONCAT24((ushort)(sStack_8c < sStack_9c) * sStack_9c |
                                       (ushort)(sStack_8c >= sStack_9c) * sStack_8c,
                                       CONCAT22((ushort)(sStack_8e < sStack_9e) * sStack_9e |
                                                (ushort)(sStack_8e >= sStack_9e) * sStack_8e,
                                                (ushort)(sStack_90 < sStack_a0) * sStack_a0 |
                                                (ushort)(sStack_90 >= sStack_a0) * sStack_90)));
          auVar27._8_8_ = uVar46;
          auVar27._0_8_ =
               CONCAT26(-(ushort)((short)pvP == 4),
                        CONCAT24(-(ushort)((short)pvP == 5),
                                 CONCAT22(-(ushort)((short)pvP == 6),-(ushort)((short)pvP == 7)))) &
               CONCAT26(-(ushort)(sStack_a2 < sStack_92),
                        CONCAT24(-(ushort)(sStack_a4 < sStack_94),
                                 CONCAT22(-(ushort)(sStack_a6 < sStack_96),
                                          -(ushort)(local_a8 < local_98))));
          if ((((((((((((((((auVar27 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar27 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar27 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar27 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar27 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar27 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar27 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar27 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (uVar46 >> 7 & 1) != 0) || (uVar46 >> 0xf & 1) != 0) ||
                  (uVar46 >> 0x17 & 1) != 0) || (uVar46 >> 0x1f & 1) != 0) ||
                (uVar46 >> 0x27 & 1) != 0) || (uVar46 >> 0x2f & 1) != 0) ||
              (uVar46 >> 0x37 & 1) != 0) || (long)uVar46 < 0) {
            matrix._4_4_ = end_query;
          }
        }
        local_71a = uVar28;
        if (s2_end != 0) {
          for (end_ref = 0; end_ref < iVar32; end_ref = end_ref + 1) {
            vMaxH[0] = vMaxH[0] << 0x10 | (ulong)vPosMask[1] >> 0x30;
            vPosMask[1] = vPosMask[1] << 0x10;
          }
          local_71a = vMaxH[0]._6_2_;
        }
        s1Len = iVar1 + -1;
        if (s1_end != 0) {
          _temp = ptr_02;
          for (k = 0; k < iVar31 * 8; k = k + 1) {
            iVar33 = k / 8 + (k % 8) * iVar31;
            if (iVar33 < iVar1) {
              if ((short)local_71a < (short)(*_temp)[0]) {
                local_71a = (ushort)(*_temp)[0];
                matrix._4_4_ = s2Len + -1;
                s1Len = iVar33;
              }
              else if ((((ushort)(*_temp)[0] == local_71a) && (matrix._4_4_ == s2Len + -1)) &&
                      (iVar33 < s1Len)) {
                s1Len = iVar33;
              }
            }
            _temp = (__m128i *)((long)*_temp + 2);
          }
        }
        if ((s1_end == 0) && (s2_end == 0)) {
          vH_1[0] = ptr_02[iVar34][1];
          uStack_8a8 = ptr_02[iVar34][0];
          for (end_ref = 0; end_ref < iVar32; end_ref = end_ref + 1) {
            vH_1[0] = vH_1[0] << 0x10 | uStack_8a8 >> 0x30;
            uStack_8a8 = uStack_8a8 << 0x10;
          }
          local_71a = vH_1[0]._6_2_;
          matrix._4_4_ = s2Len + -1;
          s1Len = iVar1 + -1;
        }
        local_28 = (short)vSaturationCheckMax[1];
        sStack_26 = (short)((ulong)vSaturationCheckMax[1] >> 0x10);
        sStack_24 = (short)((ulong)vSaturationCheckMax[1] >> 0x20);
        sStack_22 = (short)((ulong)vSaturationCheckMax[1] >> 0x30);
        sStack_20 = (short)vSaturationCheckMin[0];
        sStack_1e = (short)((ulong)vSaturationCheckMin[0] >> 0x10);
        sStack_1c = (short)((ulong)vSaturationCheckMin[0] >> 0x20);
        sStack_1a = (short)((ulong)vSaturationCheckMin[0] >> 0x30);
        local_b8 = (short)vMaxH[1];
        sStack_b6 = (short)((ulong)vMaxH[1] >> 0x10);
        sStack_b4 = (short)((ulong)vMaxH[1] >> 0x20);
        sStack_b2 = (short)((ulong)vMaxH[1] >> 0x30);
        sStack_b0 = (short)vSaturationCheckMax[0];
        sStack_ae = (short)((ulong)vSaturationCheckMax[0] >> 0x10);
        sStack_ac = (short)((ulong)vSaturationCheckMax[0] >> 0x20);
        sStack_aa = (short)((ulong)vSaturationCheckMax[0] >> 0x30);
        uVar46 = CONCAT26(-(ushort)(sStack_1a < (short)uVar28),
                          CONCAT24(-(ushort)(sStack_1c < (short)uVar28),
                                   CONCAT22(-(ushort)(sStack_1e < (short)uVar28),
                                            -(ushort)(sStack_20 < (short)uVar28)))) |
                 CONCAT26(-(ushort)(sVar29 < sStack_aa),
                          CONCAT24(-(ushort)(sVar29 < sStack_ac),
                                   CONCAT22(-(ushort)(sVar29 < sStack_ae),
                                            -(ushort)(sVar29 < sStack_b0))));
        auVar26._8_8_ = uVar46;
        auVar26._0_8_ =
             CONCAT26(-(ushort)(sStack_22 < (short)uVar28),
                      CONCAT24(-(ushort)(sStack_24 < (short)uVar28),
                               CONCAT22(-(ushort)(sStack_26 < (short)uVar28),
                                        -(ushort)(local_28 < (short)uVar28)))) |
             CONCAT26(-(ushort)(sVar29 < sStack_b2),
                      CONCAT24(-(ushort)(sVar29 < sStack_b4),
                               CONCAT22(-(ushort)(sVar29 < sStack_b6),-(ushort)(sVar29 < local_b8)))
                     );
        if ((((((((((((((((auVar26 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar26 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar26 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar26 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar26 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar26 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (uVar46 >> 7 & 1) != 0) || (uVar46 >> 0xf & 1) != 0) || (uVar46 >> 0x17 & 1) != 0)
               || (uVar46 >> 0x1f & 1) != 0) || (uVar46 >> 0x27 & 1) != 0) ||
             (uVar46 >> 0x2f & 1) != 0) || (uVar46 >> 0x37 & 1) != 0) || (long)uVar46 < 0) {
          *(uint *)&_segNum->field_0xc = *(uint *)&_segNum->field_0xc | 0x40;
          local_71a = 0;
          s1Len = 0;
          matrix._4_4_ = 0;
        }
        *(int *)&_segNum->s1 = (int)(short)local_71a;
        *(int32_t *)((long)&_segNum->s1 + 4) = s1Len;
        _segNum->s1Len = matrix._4_4_;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        profile_local = _segNum;
      }
    }
  }
  return (parasail_result_t *)profile_local;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi16(_mm_set1_epi16(position),
            _mm_set_epi16(0,1,2,3,4,5,6,7));
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
            /* long queries and/or large penalties will break the pseudo prefix scan */
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vGapper);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        vHp = _mm_insert_epi16(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_subs_epi16(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vHt = _mm_insert_epi16(vHt, boundary[j+1], 0);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 

        /* extract vector containing last value from column */
        {
            __m128i vCompare;
            vH = _mm_load_si128(pvH + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi16(vH, vMaxH));
            vMaxH = _mm_max_epi16(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 2);
        }
        score = (int16_t) _mm_extract_epi16(vMaxH, 7);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int16_t *t = (int16_t*)pvH;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            score = (int16_t) _mm_extract_epi16 (vH, 7);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}